

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNATrie.cpp
# Opt level: O3

int __thiscall DNANode::remove(DNANode *this,char *__filename)

{
  long in_RAX;
  long in_RDX;
  
  if (in_RDX != 0) {
    in_RAX = 0;
    do {
      this = this->childNodes[*(uint *)(__filename + in_RAX * 4)];
      if (this == (DNANode *)0x0) goto LAB_00101361;
      in_RAX = in_RAX + 1;
    } while (in_RDX != in_RAX);
  }
  this->count = -1;
LAB_00101361:
  return (int)in_RAX;
}

Assistant:

void DNANode::remove(const DNA::Base* dna, size_t size)
{
    if (!size) {
        count = -1;
        return;
    }
    DNANode* nextNode = childNodes[*dna];
    if (nextNode != nullptr)
        nextNode->remove(dna + 1, size - 1);
}